

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

int __thiscall phosg::BitReader::truncate(BitReader *this,char *__file,__off_t __length)

{
  invalid_argument *this_00;
  size_t new_size_local;
  BitReader *this_local;
  
  if ((char *)this->length < __file) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(this_00,"BitReader contents cannot be extended");
    __cxa_throw(this_00,&::std::invalid_argument::typeinfo,
                ::std::invalid_argument::~invalid_argument);
  }
  this->length = (size_t)__file;
  return (int)this;
}

Assistant:

void BitReader::truncate(size_t new_size) {
  if (this->length < new_size) {
    throw invalid_argument("BitReader contents cannot be extended");
  }
  this->length = new_size;
}